

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall
BailOutRecord::RestoreValue
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,Var *values
          ,ScriptContext *scriptContext,bool fromLoopBody,Var *registerSaves,
          InterpreterStackFrame *newInstance,Var *pArgumentsObject,void *argoutRestoreAddress,
          uint regSlot,int offset,bool isLocal,bool isFloat64,bool isInt32)

{
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  RegNum RVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  uint32 uVar7;
  uint uVar8;
  uint uVar9;
  RegSlot RVar10;
  FunctionBody *pFVar11;
  undefined4 *puVar12;
  Var instance;
  Var pvVar13;
  JavascriptCallStackLayout *extraout_RDX;
  JavascriptCallStackLayout *extraout_RDX_00;
  JavascriptCallStackLayout *extraout_RDX_01;
  JavascriptCallStackLayout *extraout_RDX_02;
  JavascriptCallStackLayout *layout_00;
  byte bVar14;
  char16 *form;
  char16_t *pcVar15;
  Var oldValue;
  ulong uVar16;
  ulong uVar17;
  Var local_58;
  
  pcVar15 = L"OutParam";
  if (isLocal) {
    pcVar15 = L"Register";
  }
  if (DAT_0145948a == '\x01') {
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
    if ((bVar3) &&
       ((DAT_0145c3a8 == DAT_0145c3b0 ||
        (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
      Output::Print(L"BailOut:   %s #%3d: ",pcVar15,(ulong)regSlot);
    }
  }
  if (offset < 0) {
    if (argoutRestoreAddress == (void *)0x0) {
      if (isFloat64) {
        local_58 = (Var)Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
        goto LAB_003e384f;
      }
      if (isInt32) {
        uVar9 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
        local_58 = (Var)0x0;
        instance = (Var)0x0;
        uVar17 = (ulong)uVar9;
      }
      else {
        instance = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        bVar3 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar11);
        local_58 = (Var)0x0;
        uVar17 = 0;
        if (bVar3) {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          bVar3 = Js::FunctionBody::IsNonTempLocalVar(pFVar11,regSlot);
          if ((instance == (Var)0xcececececececece) && (uVar17 = 0, bVar3)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            uVar5 = 0x379;
            goto LAB_003e3b9f;
          }
        }
      }
    }
    else {
      local_58 = (Var)0x0;
      if (isLocal) {
LAB_003e384f:
        instance = (Var)0x0;
        uVar17 = 0;
      }
      else {
        if (isFloat64 || isInt32) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,900,"(!isFloat64 && !isInt32)","!isFloat64 && !isInt32");
          if (!bVar3) goto LAB_003e41fb;
          *puVar12 = 0;
        }
        instance = *(Var *)((long)argoutRestoreAddress + (ulong)(regSlot * 8));
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        bVar3 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar11);
        if (bVar3) {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          bVar3 = Js::FunctionBody::IsNonTempLocalVar(pFVar11,regSlot);
          if (instance == (Var)0xcececececececece && bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            uVar5 = 0x38a;
LAB_003e3b9f:
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,uVar5,
                               "(!(newInstance->function->GetFunctionBody()->IsInDebugMode() && newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) && value == (Js::Var)Func::c_debugFillPattern))"
                               ,
                               "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code."
                              );
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
            instance = (Var)0xcececececececece;
          }
        }
        local_58 = (Var)0x0;
        uVar17 = 0;
      }
    }
    if (DAT_0145948a == '\x01') {
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
      if ((bVar3) &&
         ((DAT_0145c3a8 == DAT_0145c3b0 ||
          (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
        Output::Print(L"Stack offset %6d",(ulong)(uint)offset);
      }
    }
LAB_003e3c52:
    if (isFloat64) {
LAB_003e3c5c:
      pvVar13 = Js::JavascriptNumber::ToVar((double)local_58);
      if (DAT_0145948a == '\x01') {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
        if ((bVar3) &&
           ((DAT_0145c3a8 == DAT_0145c3b0 ||
            (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
          Output::Print(L", value: %f (ToVar: 0x%p)",local_58,pvVar13);
        }
      }
    }
    else {
      bVar14 = (byte)((uint)offset >> 0x1f);
LAB_003e3d17:
      if (isInt32) {
        if (instance != (void *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3de,"(!value)","!value");
          if (!bVar3) {
LAB_003e41fb:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar12 = 0;
        }
        pvVar13 = (Var)(uVar17 | 0x1000000000000);
        if (DAT_0145948a == '\x01') {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
          if ((bVar3) &&
             ((DAT_0145c3a8 == DAT_0145c3b0 ||
              (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
            Output::Print(L", value: %10d (ToVar: 0x%p)",uVar17,pvVar13);
          }
        }
      }
      else {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        RVar10 = Js::FunctionBody::GetYieldRegister(pFVar11);
        pvVar13 = instance;
        if (RVar10 == regSlot) {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          bVar3 = Js::FunctionProxy::IsCoroutine((FunctionProxy *)pFVar11);
          if (bVar3) {
            if (instance == (void *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar12 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x3e6,"(value)","value");
              if (!bVar3) goto LAB_003e41fb;
              *puVar12 = 0;
            }
            bVar3 = ThreadContext::IsOnStack(instance);
            if (bVar3) {
              if (DAT_0145948a != '\0') {
                pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                    (*(JavascriptFunction **)(newInstance + 0x80));
                uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
                pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                    (*(JavascriptFunction **)(newInstance + 0x80));
                LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
                bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
                if ((bVar3) &&
                   ((DAT_0145c3a8 == DAT_0145c3b0 ||
                    (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)
                    ))) {
                  pcVar15 = L", value: 0x%p (Resume Yield Object)";
LAB_003e41ec:
                  Output::Print(pcVar15,instance);
                }
              }
            }
            else if (DAT_0145948a != '\0') {
              pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                  (*(JavascriptFunction **)(newInstance + 0x80));
              uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
              pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                  (*(JavascriptFunction **)(newInstance + 0x80));
              LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
              bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
              if ((bVar3) &&
                 ((DAT_0145c3a8 == DAT_0145c3b0 ||
                  (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))
                 ) {
                pcVar15 = L", value: 0x%p (Yield Return Value)";
                goto LAB_003e41ec;
              }
            }
            goto LAB_003e3e1c;
          }
        }
        if (DAT_0145948a == '\x01') {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
          if ((bVar3) &&
             ((DAT_0145c3a8 == DAT_0145c3b0 ||
              (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
            Output::Print(L", value: 0x%p",instance);
          }
        }
        if (((bVar14 != 0) &&
            (pvVar13 = Js::JavascriptOperators::BoxStackInstance(instance,scriptContext,true,false),
            instance != pvVar13)) && (DAT_0145948a == '\x01')) {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
          if ((bVar3) &&
             ((DAT_0145c3a8 == DAT_0145c3b0 ||
              (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
            Output::Print(L" (Boxed: 0x%p)",pvVar13);
          }
        }
      }
    }
LAB_003e3e1c:
    values[regSlot] = pvVar13;
    if (DAT_0145948a != '\x01') {
      return;
    }
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
    if (!bVar3) {
      return;
    }
    form = L"\n";
    if (DAT_0145c3a8 == DAT_0145c3b0) goto LAB_003e3eaf;
  }
  else {
    if (offset != 0) {
      uVar5 = GetBailOutRegisterSaveSlotCount();
      if (uVar5 < (uint)offset) {
        uVar7 = GetArgumentsObjectOffset();
        if (uVar7 == offset) {
          layout_00 = extraout_RDX;
          if (isFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3b4,"(!isFloat64)","!isFloat64");
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
            layout_00 = extraout_RDX_00;
          }
          if (isInt32) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3b5,"(!isInt32)","!isInt32");
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
            layout_00 = extraout_RDX_01;
          }
          if (fromLoopBody) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3b6,"(!fromLoopBody)","!fromLoopBody");
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
            layout_00 = extraout_RDX_02;
          }
          instance = *pArgumentsObject;
          if ((instance == (Var)0x0) &&
             (instance = EnsureArguments(this,newInstance,layout_00,scriptContext,pArgumentsObject),
             instance == (Var)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3bc,"(value)","value");
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
            instance = (Var)0x0;
          }
          uVar17 = 0;
          local_58 = (Var)0x0;
          if (DAT_0145948a == '\x01') {
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
            if ((bVar3) &&
               ((DAT_0145c3a8 == DAT_0145c3b0 ||
                (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3))))
            {
              uVar17 = 0;
              Output::Print(L"Arguments object");
            }
          }
        }
        else {
          uVar5 = GetBailOutRegisterSaveSlotCount();
          uVar8 = GetBailOutReserveSlotCount();
          uVar16 = (ulong)(~(uVar8 + uVar5) + offset);
          instance = this->constants[uVar16];
          uVar17 = 0;
          if (isInt32) {
            uVar17 = (ulong)instance & 0xffffffff;
            instance = (Var)0x0;
          }
          local_58 = (Var)0x0;
          if (DAT_0145948a == '\x01') {
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
            if ((bVar3) &&
               ((DAT_0145c3a8 == DAT_0145c3b0 ||
                (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3))))
            {
              Output::Print(L"Constant index %4d",uVar16);
            }
          }
        }
        goto LAB_003e3c52;
      }
      if (registerSaves == (Var *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x396,"(registerSaves)","registerSaves");
        if (!bVar3) goto LAB_003e41fb;
        *puVar12 = 0;
      }
      RVar4 = LinearScanMD::GetRegisterFromSaveIndex(offset);
      IVar1 = RegTypes[RVar4];
      uVar17 = (ulong)(uint)offset;
      if (!isFloat64) {
        if (isInt32) {
          if (IVar1 == TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3a6,
                               "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                               ,
                               "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                              );
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
          }
          uVar17 = (ulong)*(uint *)(registerSaves + (uVar17 - 1));
          instance = (void *)0x0;
        }
        else {
          if (IVar1 == TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3ab,
                               "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                               ,
                               "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                              );
            if (!bVar3) goto LAB_003e41fb;
            *puVar12 = 0;
          }
          instance = registerSaves[uVar17 - 1];
          uVar17 = 0;
        }
        bVar14 = 1;
        if (DAT_0145948a == '\x01') {
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
          if ((bVar3) &&
             ((DAT_0145c3a8 == DAT_0145c3b0 ||
              (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
            RVar4 = LinearScanMD::GetRegisterFromSaveIndex(offset);
            Output::Print(L"Register %-4S  %4d",RegNames[RVar4],(ulong)(uint)offset);
          }
        }
        goto LAB_003e3d17;
      }
      if (IVar1 != TyFloat64) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x39a,
                           "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64)"
                           ,"RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64")
        ;
        if (!bVar3) goto LAB_003e41fb;
        *puVar12 = 0;
      }
      local_58 = registerSaves[uVar17 - 1];
      if (DAT_0145948a == '\x01') {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
        if ((bVar3) &&
           ((DAT_0145c3a8 == DAT_0145c3b0 ||
            (bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind), bVar3)))) {
          RVar4 = LinearScanMD::GetRegisterFromSaveIndex(offset);
          Output::Print(L"Register %-4S  %4d",RegNames[RVar4],(ulong)(uint)offset);
        }
      }
      goto LAB_003e3c5c;
    }
    if (DAT_0145948a != '\x01') {
      return;
    }
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
    if (!bVar3) {
      return;
    }
    form = L"Not live\n";
    if (DAT_0145c3a8 == DAT_0145c3b0) goto LAB_003e3eaf;
  }
  bVar3 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c388,bailOutKind);
  if (!bVar3) {
    return;
  }
LAB_003e3eaf:
  Output::Print(form);
  return;
}

Assistant:

void
BailOutRecord::RestoreValue(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress,
    uint regSlot, int offset, bool isLocal, bool isFloat64, bool isInt32) const
{
    bool boxStackInstance = true;
    Js::Var value = 0;
    double dblValue = 0.0;
    int32 int32Value = 0;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 const * name = _u("OutParam");
    if (isLocal)
    {
        name = _u("Register");
    }
#endif

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   %s #%3d: "), name, regSlot);

    if (offset < 0)
    {
        // Stack offset are negative
        if (!argoutRestoreAddress)
        {
            if (isFloat64)
            {
                dblValue = layout->GetDoubleAtOffset(offset);
            }
            else if (isInt32)
            {
                int32Value = layout->GetInt32AtOffset(offset);
            }
            else
            {
                value = layout->GetOffset(offset);
                AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                    newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                    value == (Js::Var)Func::c_debugFillPattern),
                    "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");
            }
        }
        else if (!isLocal)
        {
            // If we have:
            // try {
            //      bar(a, b, c);
            // } catch(..) {..}
            // and we bailout during bar args evaluation, we recover from args from argoutRestoreAddress, not from caller function frame.
            // This is because try-catch is implemented as a C wrapper, so args will be a different offset from rbp in that case.
            Assert(!isFloat64 && !isInt32);

            value = *((Js::Var *)(((char *)argoutRestoreAddress) + regSlot * MachPtr));
            AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                value == (Js::Var)Func::c_debugFillPattern),
                "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");

        }

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Stack offset %6d"), offset);
    }
    else if (offset > 0)
    {
        if ((uint)offset <= GetBailOutRegisterSaveSlotCount())
        {
            // Register save space (offset is the register number and index into the register save space)
            // Index is one based, so subtract one
            AssertOrFailFast(registerSaves);

            if (isFloat64)
            {
                Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64);
                dblValue = *((double*)&(registerSaves[offset - 1]));
#ifdef _M_ARM
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[(offset - RegD0) / 2 + RegD0], offset);
#else
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
#endif
            }
            else
            {
                if (isInt32)
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    int32Value = ::Math::PointerCastToIntegralTruncate<int32>(registerSaves[offset - 1]);
                }
                else
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    value = registerSaves[offset - 1];
                }

                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
            }
        }
        else if (BailOutRecord::IsArgumentsObject((uint)offset))
        {
            Assert(!isFloat64);
            Assert(!isInt32);
            Assert(!fromLoopBody);
            value = *pArgumentsObject;
            if (value == nullptr)
            {
                value = EnsureArguments(newInstance, layout, scriptContext, pArgumentsObject);
            }
            Assert(value);
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Arguments object"));
            boxStackInstance = false;
        }
        else
        {
            // Constants offset starts from max bail out register save slot count;
            uint constantIndex = offset - (GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount()) - 1;
            if (isInt32)
            {
                int32Value = ::Math::PointerCastToIntegralTruncate<int32>(this->constants[constantIndex]);
            }
            else
            {
                value = this->constants[constantIndex];
            }
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Constant index %4d"), constantIndex);
            boxStackInstance = false;
        }
    }
    else
    {
        // Consider Assert(false) here
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Not live\n"));
        return;
    }

    if (isFloat64)
    {
        value = Js::JavascriptNumber::New(dblValue, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
    }
    else if (isInt32)
    {
        Assert(!value);
        value = Js::JavascriptNumber::ToVar(int32Value, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else if (regSlot == newInstance->function->GetFunctionBody()->GetYieldRegister() && newInstance->function->GetFunctionBody()->IsCoroutine())
    {
        // This value can only either be a resume yield object created on the heap or
        // an iterator result object created on the heap. No need to box either.
        Assert(value);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (ThreadContext::IsOnStack(value))
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Resume Yield Object)"), value);
        }
        else
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Yield Return Value)"), value);
        }
#endif
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, scriptContext, /* allowStackFunction */ true, /* deepCopy */ false);

            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), value);
            }
        }
    }

    values[regSlot] = value;

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
}